

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

Type * get_pointer_type(Type *points_to,char is_const,char is_volatile)

{
  Type *pTVar1;
  Type_Pointer *ret;
  char is_volatile_local;
  char is_const_local;
  Type *points_to_local;
  
  pTVar1 = (Type *)calloc(1,0x28);
  pTVar1->specifier = TS_POINTER;
  *(undefined8 *)(pTVar1 + 1) = 4;
  pTVar1[1].node = (Map *)points_to;
  *(undefined1 *)&pTVar1[2].specifier = (char)pTVar1[2].specifier & 0xfe | is_const & TS_CHAR;
  *(byte *)&pTVar1[2].specifier = (char)pTVar1[2].specifier & 0xfd | (is_volatile & 1U) << 1;
  pTVar1 = type_check_and_push(pTVar1,points_to->node,0x28);
  return pTVar1;
}

Assistant:

struct Type* get_pointer_type(struct Type *points_to,char is_const,char is_volatile)
{
	struct Type_Pointer *ret;
	ret=calloc(1,sizeof(struct Type_Pointer));
	ret->specifier=TS_POINTER;
	ret->size=PTR_SIZE;
	ret->points_to=points_to;
	ret->is_const=is_const;
	ret->is_volatile=is_volatile;

	ret=(struct Type_Pointer*)type_check_and_push((struct Type*)ret,points_to->node,sizeof(struct Type_Pointer));
	return (struct Type*)ret;

}